

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passes.hpp
# Opt level: O3

Program __thiscall Inlining::run(Inlining *this,Program *program)

{
  Function *pFVar1;
  Type *pTVar2;
  Function *pFVar3;
  mapped_type *pmVar4;
  Function *extraout_RDX;
  Program PVar5;
  Function *main_function;
  FunctionTable function_table;
  Analyze analyze;
  Function *local_68;
  _Rb_tree<const_Function_*,_std::pair<const_Function_*const,_Inlining::FunctionTableEntry>,_std::_Select1st<std::pair<const_Function_*const,_Inlining::FunctionTableEntry>_>,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Inlining::FunctionTableEntry>_>_>
  local_60;
  Analyze local_30;
  
  pFVar1 = program->first;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_30.super_Visitor<void>._vptr_Visitor = (_func_int **)&PTR_visit_int_literal_00154758;
  local_30.function_table = (FunctionTable *)&local_60;
  local_68 = pFVar1;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  local_30.function = pFVar1;
  Analyze::evaluate(&local_30,&pFVar1->block);
  pFVar3 = (Function *)operator_new(0x60);
  pTVar2 = pFVar1->return_type;
  (pFVar3->path)._M_dataplus._M_p = (pointer)&(pFVar3->path).field_2;
  (pFVar3->path)._M_string_length = 0;
  (pFVar3->path).field_2._M_local_buf[0] = '\0';
  (pFVar3->block).first = (Expression *)0x0;
  (pFVar3->block).last = (Expression *)0x0;
  pFVar3->arguments = 0;
  (pFVar3->argument_types).super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pFVar3->argument_types).super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pFVar3->argument_types).super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar3->return_type = pTVar2;
  pFVar3->next_function = (Function *)0x0;
  *(Function **)this = pFVar3;
  *(Function **)(this + 8) = pFVar3;
  pmVar4 = std::
           map<const_Function_*,_Inlining::FunctionTableEntry,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Inlining::FunctionTableEntry>_>_>
           ::operator[]((map<const_Function_*,_Inlining::FunctionTableEntry,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Inlining::FunctionTableEntry>_>_>
                         *)&local_60,&local_68);
  pmVar4->new_function = pFVar3;
  Replace::evaluate((Program *)this,(FunctionTable *)&local_60,local_68,&pFVar3->block,
                    &local_68->block);
  std::
  _Rb_tree<const_Function_*,_std::pair<const_Function_*const,_Inlining::FunctionTableEntry>,_std::_Select1st<std::pair<const_Function_*const,_Inlining::FunctionTableEntry>_>,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Inlining::FunctionTableEntry>_>_>
  ::~_Rb_tree(&local_60);
  PVar5.last = extraout_RDX;
  PVar5.first = (Function *)this;
  return PVar5;
}

Assistant:

static Program run(const Program& program) {
		const Function* main_function = program.get_main_function();
		Program new_program;
		FunctionTable function_table;
		Analyze analyze(function_table, main_function);
		analyze.evaluate(main_function->get_block());
		Function* new_function = new Function(main_function->get_return_type());
		new_program.add_function(new_function);
		function_table[main_function].new_function = new_function;
		Replace::evaluate(&new_program, function_table, main_function, new_function->get_block(), main_function->get_block());
		return new_program;
	}